

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall QPDF::writeHGeneric(QPDF *this,BitWriter *w,HGeneric *t)

{
  BitWriter::writeBitsInt(w,t->first_object,0x20);
  if (t->first_object_offset < 0) {
    QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(t->first_object_offset);
  }
  BitWriter::writeBits(w,t->first_object_offset,0x20);
  BitWriter::writeBitsInt(w,t->nobjects,0x20);
  BitWriter::writeBitsInt(w,t->group_length,0x20);
  return;
}

Assistant:

void
QPDF::writeHGeneric(BitWriter& w, HGeneric& t)
{
    w.writeBitsInt(t.first_object, 32);            // 1
    w.writeBits(toULL(t.first_object_offset), 32); // 2
    w.writeBitsInt(t.nobjects, 32);                // 3
    w.writeBitsInt(t.group_length, 32);            // 4
}